

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_yplus_lengthscale2
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  int *piVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_NODE ref_node_00;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  uint uVar8;
  REF_DBL *pRVar9;
  long lVar10;
  undefined8 uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  REF_INT new_node;
  REF_INT ntri;
  REF_GLOB global;
  REF_GRID exchange_grid;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  double *local_1e8;
  uint local_1dc;
  REF_CELL local_1d8;
  REF_CELL local_1d0;
  REF_CELL local_1c8;
  double local_1c0;
  double local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  REF_GRID local_1a0;
  REF_DBL *local_198;
  undefined8 uStack_190;
  double local_188;
  double local_180;
  double local_178;
  double local_168 [4];
  void *local_148;
  REF_CELL local_140;
  long local_138;
  REF_DBL local_130;
  REF_DBL local_128;
  REF_DBL local_120;
  undefined8 local_118;
  int local_a8;
  int local_a4;
  int local_a0;
  
  if (ref_grid->twod == 0) {
    uVar11 = 0x34c;
  }
  else {
    ref_node = ref_grid->node;
    local_130 = mach;
    local_128 = re;
    local_120 = reference_t_k;
    uVar5 = ref_grid_create(&local_1a0,ref_grid->mpi);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x34f,
             "ref_phys_yplus_lengthscale2",(ulong)uVar5,"create exchange");
      return uVar5;
    }
    uVar5 = 6;
    ref_node_00 = local_1a0->node;
    iVar12 = ref_node->max;
    lVar14 = (long)iVar12;
    if (0 < lVar14) {
      pRVar3 = ref_node->global;
      lVar10 = 0;
      do {
        if (-1 < pRVar3[lVar10]) {
          lengthscale[lVar10] = 0.0;
        }
        lVar10 = lVar10 + 1;
      } while (lVar14 != lVar10);
    }
    if (iVar12 < 0) {
      uVar5 = 1;
      pcVar15 = "malloc hits of REF_INT negative";
LAB_001d4857:
      bVar16 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x352,
             "ref_phys_yplus_lengthscale2",pcVar15);
      local_148 = (void *)0x0;
    }
    else {
      local_148 = malloc(lVar14 << 2);
      if (local_148 == (void *)0x0) {
        uVar5 = 2;
        pcVar15 = "malloc hits of REF_INT NULL";
        goto LAB_001d4857;
      }
      bVar16 = true;
      if (0 < ref_node->max) {
        lVar14 = 0;
        do {
          *(undefined4 *)((long)local_148 + lVar14 * 4) = 0;
          lVar14 = lVar14 + 1;
        } while (lVar14 < ref_node->max);
      }
    }
    if (!bVar16) {
      return uVar5;
    }
    uVar6 = ref_node_initialize_n_global(ref_node_00,0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x354,
             "ref_phys_yplus_lengthscale2",(ulong)uVar6,"init nnodesg");
      return uVar6;
    }
    iVar12 = ref_grid->cell[0]->max;
    local_1d8 = (REF_CELL)CONCAT71(local_1d8._1_7_,0 < iVar12);
    if (0 < iVar12) {
      local_1c8 = ref_grid->cell[3];
      uVar13 = 0;
      local_1d0 = ref_grid->cell[0];
      do {
        RVar7 = ref_cell_nodes(local_1d0,(REF_INT)uVar13,(REF_INT *)&local_118);
        if (RVar7 == 0) {
          uVar6 = ref_layer_interior_seg_normal(ref_grid,(REF_INT)uVar13,local_168);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x361,"ref_phys_yplus_lengthscale2",(ulong)uVar6,"edge norm");
            uVar5 = uVar6;
            break;
          }
          uVar6 = ref_cell_list_with2(ref_grid->cell[3],(REF_INT)local_118,local_118._4_4_,2,
                                      (REF_INT *)&local_1b0,(REF_INT *)&local_188);
          iVar12 = (int)local_1b0;
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x364,"ref_phys_yplus_lengthscale2",(ulong)uVar6,"tri with2");
            uVar5 = uVar6;
            break;
          }
          uVar6 = uVar5;
          if ((long)(int)local_1b0 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x365,"ref_phys_yplus_lengthscale2","edg expects one tri",1,(long)(int)local_1b0)
            ;
            uVar6 = 1;
          }
          uVar5 = uVar6;
          if (iVar12 != 1) break;
          uVar5 = ref_cell_nodes(local_1c8,local_188._0_4_,&local_a8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x367,"ref_phys_yplus_lengthscale2",(ulong)uVar5,"tri nodes");
            break;
          }
          lVar14 = (long)(REF_INT)local_118;
          pRVar9 = ref_node->real;
          lVar10 = (long)((((local_a8 - (REF_INT)local_118) + local_a4 + local_a0) - local_118._4_4_
                          ) * 0xf);
          local_1c0 = (pRVar9[lVar10 + 1] - pRVar9[lVar14 * 0xf + 1]) * local_168[1];
          local_1b8 = (pRVar9[lVar10] - pRVar9[lVar14 * 0xf]) * local_168[0];
          local_198 = (REF_DBL *)((pRVar9[lVar10 + 2] - pRVar9[lVar14 * 0xf + 2]) * local_168[2]);
          uStack_190 = 0;
          uVar5 = ref_node_next_global(ref_node_00,&local_1a8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x372,"ref_phys_yplus_lengthscale2",(ulong)uVar5,"next");
            break;
          }
          uVar5 = ref_node_add(ref_node_00,CONCAT44(local_1a8._4_4_,(REF_INT)local_1a8),
                               (REF_INT *)&local_1dc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x373,"ref_phys_yplus_lengthscale2",(ulong)uVar5,"add node");
            break;
          }
          if (uVar13 != local_1dc) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x374,"ref_phys_yplus_lengthscale2","expects new node to match edg",uVar13,
                   (long)(int)local_1dc);
            uVar5 = 1;
            break;
          }
          dVar17 = (double)local_198 + local_1b8 + local_1c0;
          if (dVar17 <= -dVar17) {
            dVar17 = -dVar17;
          }
          pRVar9 = ref_node->real;
          pRVar4 = ref_node_00->real;
          lVar14 = 0;
          do {
            pRVar4[(long)(int)local_1dc * 0xf + lVar14] =
                 (pRVar9[(long)(REF_INT)local_118 * 0xf + lVar14] +
                 pRVar9[(long)local_118._4_4_ * 0xf + lVar14]) * 0.5 +
                 local_168[lVar14] * (dVar17 + dVar17);
            lVar14 = lVar14 + 1;
            uVar5 = uVar6;
          } while (lVar14 != 3);
        }
        uVar13 = uVar13 + 1;
        local_1d8 = (REF_CELL)CONCAT71(local_1d8._1_7_,(long)uVar13 < (long)local_1d0->max);
      } while ((long)uVar13 < (long)local_1d0->max);
    }
    if (((ulong)local_1d8 & 1) != 0) {
      return uVar5;
    }
    uVar6 = ref_node_synchronize_globals(ref_node_00);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x37d,
             "ref_phys_yplus_lengthscale2",(ulong)uVar6,"sync global");
      return uVar6;
    }
    uVar6 = ref_node_00->max * ldim;
    if ((int)uVar6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x37e,
             "ref_phys_yplus_lengthscale2","malloc exchange_field of REF_DBL negative");
      return 1;
    }
    pRVar9 = (REF_DBL *)malloc((ulong)uVar6 << 3);
    if (pRVar9 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x37e,
             "ref_phys_yplus_lengthscale2","malloc exchange_field of REF_DBL NULL");
      return 2;
    }
    local_198 = pRVar9;
    uVar6 = ref_interp_create((REF_INTERP *)&local_118,ref_grid,local_1a0);
    if (uVar6 == 0) {
      uVar6 = ref_interp_locate((REF_INTERP)CONCAT44(local_118._4_4_,(REF_INT)local_118));
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",899,
               "ref_phys_yplus_lengthscale2",(ulong)uVar6,"nearest");
        goto LAB_001d4dc0;
      }
      uVar8 = ref_interp_scalar((REF_INTERP)CONCAT44(local_118._4_4_,(REF_INT)local_118),ldim,field,
                                local_198);
      bVar16 = uVar8 == 0;
      uVar6 = uVar5;
      if (!bVar16) {
        bVar16 = false;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x385,"ref_phys_yplus_lengthscale2",(ulong)uVar8,"interp scalar");
        uVar6 = uVar8;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x382,
             "ref_phys_yplus_lengthscale2",(ulong)uVar6,"make interp");
LAB_001d4dc0:
      bVar16 = false;
    }
    if (!bVar16) {
      return uVar6;
    }
    if (ref_grid->twod != 0) {
      iVar12 = ref_grid->cell[0]->max;
      bVar16 = 0 < iVar12;
      if (0 < iVar12) {
        local_140 = ref_grid->cell[3];
        local_1e8 = local_198 + 3;
        local_1d0 = (REF_CELL)((long)ldim << 3);
        dVar17 = 0.0;
        local_1d8 = ref_grid->cell[0];
        do {
          RVar7 = ref_cell_nodes(local_1d8,SUB84(dVar17,0),(REF_INT *)&local_118);
          if (RVar7 == 0) {
            local_1b8 = dVar17;
            uVar5 = ref_layer_interior_seg_normal(ref_grid,SUB84(dVar17,0),local_168);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x394,"ref_phys_yplus_lengthscale2",(ulong)uVar5,"edge norm");
              uVar6 = uVar5;
              break;
            }
            uVar8 = ref_cell_list_with2(ref_grid->cell[3],(REF_INT)local_118,local_118._4_4_,2,
                                        (REF_INT *)&local_1dc,(REF_INT *)&local_1a8);
            uVar5 = local_1dc;
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x397,"ref_phys_yplus_lengthscale2",(ulong)uVar8,"tri with2");
              uVar6 = uVar8;
              break;
            }
            uVar8 = uVar6;
            if ((long)(int)local_1dc != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x398,"ref_phys_yplus_lengthscale2","edg expects one tri",1,
                     (long)(int)local_1dc);
              uVar8 = 1;
            }
            uVar6 = uVar8;
            if (uVar5 != 1) break;
            uVar6 = ref_cell_nodes(local_140,(REF_INT)local_1a8,&local_a8);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x39a,"ref_phys_yplus_lengthscale2",(ulong)uVar6,"tri nodes");
              break;
            }
            local_1c0 = (double)(long)(REF_INT)local_118;
            local_138 = (long)local_118._4_4_;
            iVar12 = (local_a8 - (REF_INT)local_118) + local_a4 + local_a0;
            pRVar9 = ref_node->real;
            local_1c8 = (REF_CELL)((long)local_1c0 * 0xf);
            local_188 = pRVar9[local_138 * 0xf] - pRVar9[(long)local_1c0 * 0xf];
            local_180 = pRVar9[local_138 * 0xf + 1] - pRVar9[(long)local_1c0 * 0xf + 1];
            local_178 = pRVar9[local_138 * 0xf + 2] - pRVar9[(long)local_1c0 * 0xf + 2];
            uVar6 = ref_math_normalize(&local_188);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3a4,"ref_phys_yplus_lengthscale2",(ulong)uVar6,"normalize tangent");
              break;
            }
            pRVar9 = ref_node->real;
            lVar14 = (long)((iVar12 - (int)local_138) * 0xf);
            dVar17 = 0.0 - (*local_1e8 * local_178 +
                           local_1e8[-2] * local_188 + local_180 * local_1e8[-1]);
            if (dVar17 <= -dVar17) {
              dVar17 = -dVar17;
            }
            dVar18 = (pRVar9[lVar14 + 2] - pRVar9[(long)((long)&local_1c8->type + 2)]) *
                     local_168[2] +
                     (pRVar9[lVar14] - pRVar9[(long)local_1c8]) * local_168[0] +
                     (pRVar9[lVar14 + 1] - pRVar9[(long)((long)&local_1c8->type + 1)]) *
                     local_168[1];
            if (dVar18 <= -dVar18) {
              dVar18 = -dVar18;
            }
            lVar14 = (long)(SUB84(local_1c0,0) * ldim);
            uVar6 = ref_phys_yplus_dist(local_130,local_128,local_120,field[lVar14],
                                        (field[lVar14 + 4] / field[lVar14]) * 1.4,dVar18 + dVar18,
                                        dVar17,(REF_DBL *)&local_1b0);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x3b6,"ref_phys_yplus_lengthscale2",(ulong)uVar6,"yplus dist");
              break;
            }
            lVar14 = (long)(REF_INT)local_118;
            lengthscale[lVar14] =
                 lengthscale[lVar14] + (double)CONCAT44(local_1b0._4_4_,(int)local_1b0);
            piVar1 = (int *)((long)local_148 + lVar14 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = (long)local_118._4_4_;
            lengthscale[lVar14] =
                 (double)CONCAT44(local_1b0._4_4_,(int)local_1b0) + lengthscale[lVar14];
            piVar1 = (int *)((long)local_148 + lVar14 * 4);
            *piVar1 = *piVar1 + 1;
            dVar17 = local_1b8;
            uVar6 = uVar8;
          }
          dVar17 = (double)((long)dVar17 + 1);
          local_1e8 = (double *)((long)local_1e8 + (long)local_1d0);
          bVar16 = (long)dVar17 < (long)local_1d8->max;
        } while ((long)dVar17 < (long)local_1d8->max);
      }
      if (bVar16) {
        return uVar6;
      }
      iVar12 = ref_node->max;
      if (0 < (long)iVar12) {
        pRVar3 = ref_node->global;
        lVar14 = 0;
        do {
          if ((-1 < pRVar3[lVar14]) && (iVar2 = *(int *)((long)local_148 + lVar14 * 4), 0 < iVar2))
          {
            lengthscale[lVar14] = lengthscale[lVar14] / (double)iVar2;
          }
          lVar14 = lVar14 + 1;
        } while (iVar12 != lVar14);
      }
      if (local_148 != (void *)0x0) {
        free(local_148);
      }
      uVar5 = ref_node_ghost_dbl(ref_node,lengthscale,1);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x3c6,"ref_phys_yplus_lengthscale2",(ulong)uVar5,"ghost lengthscale");
        return uVar5;
      }
      free(local_198);
      uVar5 = ref_grid_free(local_1a0);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar15 = "free";
      uVar11 = 0x3c9;
      uVar13 = (ulong)uVar5;
      goto LAB_001d47b5;
    }
    uVar11 = 0x3bd;
  }
  uVar5 = 6;
  pcVar15 = "implement 3D";
  uVar13 = 6;
LAB_001d47b5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar11,
         "ref_phys_yplus_lengthscale2",uVar13,pcVar15);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale2(REF_GRID ref_grid, REF_DBL mach,
                                               REF_DBL re,
                                               REF_DBL reference_t_k,
                                               REF_INT ldim, REF_DBL *field,
                                               REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  REF_GRID exchange_grid;
  REF_NODE exchange_node;
  REF_DBL *exchange_field;
  REF_DBL stretch = 2.0;
  if (!ref_grid_twod(ref_grid)) RSS(REF_IMPLEMENT, "implement 3D");

  RSS(ref_grid_create(&exchange_grid, ref_grid_mpi(ref_grid)),
      "create exchange");
  exchange_node = ref_grid_node(exchange_grid);
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);

  RSS(ref_node_initialize_n_global(exchange_node, 0), "init nnodesg");

  {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri, ixyz;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node, new_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    REF_GLOB global;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      RSS(ref_node_next_global(exchange_node, &global), "next");
      RSS(ref_node_add(exchange_node, global, &new_node), "add node");
      REIS(edg, new_node, "expects new node to match edg");
      for (ixyz = 0; ixyz < 3; ixyz++) {
        ref_node_xyz(exchange_node, ixyz, new_node) =
            0.5 * (ref_node_xyz(ref_node, ixyz, edg_nodes[0]) +
                   ref_node_xyz(ref_node, ixyz, edg_nodes[1])) +
            stretch * dn * edg_norm[ixyz];
      }
    }
  }
  RSS(ref_node_synchronize_globals(exchange_node), "sync global");
  ref_malloc(exchange_field, ldim * ref_node_max(exchange_node), REF_DBL);

  {
    REF_INTERP ref_interp;
    RSS(ref_interp_create(&ref_interp, ref_grid, exchange_grid), "make interp");
    RSS(ref_interp_locate(ref_interp), "nearest");
    RSS(ref_interp_scalar(ref_interp, ldim, field, exchange_field),
        "interp scalar");
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(exchange_field[1 + ldim * edg]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = stretch * ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  ref_free(exchange_field);
  RSS(ref_grid_free(exchange_grid), "free");

  return REF_SUCCESS;
}